

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O1

void formatter_suite::run(void)

{
  format_null();
  format_boolean();
  format_integer();
  format_real();
  format_string();
  fail_wstring();
  fail_u16string();
  fail_u32string();
  format_empty_array();
  format_array();
  format_empty_map();
  format_map();
  return;
}

Assistant:

void run()
{
    format_null();
    format_boolean();
    format_integer();
    format_real();
    format_string();
    fail_wstring();
    fail_u16string();
    fail_u32string();
    format_empty_array();
    format_array();
    format_empty_map();
    format_map();
}